

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O3

void __thiscall
moira::Moira::execMoveToCcr<(moira::Instr)75,(moira::Mode)6,(moira::Size)2>(Moira *this,u16 opcode)

{
  byte bVar1;
  u32 uVar2;
  bool error;
  bool local_19;
  
  uVar2 = computeEA<(moira::Mode)6,(moira::Size)2,0ul>(this,opcode & 7);
  uVar2 = readM<(moira::MemSpace)1,(moira::Size)2,128ul>(this,uVar2,&local_19);
  if (local_19 == false) {
    (*this->_vptr_Moira[0x19])(this,4);
    bVar1 = (byte)uVar2;
    (this->reg).sr.c = (bool)(bVar1 & 1);
    (this->reg).sr.v = (bool)(bVar1 >> 1 & 1);
    (this->reg).sr.z = (bool)(bVar1 >> 2 & 1);
    (this->reg).sr.n = (bool)(bVar1 >> 3 & 1);
    (this->reg).sr.x = (bool)(bVar1 >> 4 & 1);
    readM<(moira::MemSpace)2,(moira::Size)2,0ul>(this,(this->reg).pc + 2);
    uVar2 = (this->reg).pc;
    (this->reg).pc0 = uVar2;
    (this->queue).ird = (this->queue).irc;
    uVar2 = readM<(moira::MemSpace)2,(moira::Size)2,4ul>(this,uVar2 + 2);
    (this->queue).irc = (u16)uVar2;
  }
  return;
}

Assistant:

void
Moira::execMoveToCcr(u16 opcode)
{
    int src = _____________xxx(opcode);
    u32 ea, data;
    
    if (!readOp <M,S, STD_AE_FRAME> (src, ea, data)) return;

    sync(4);
    setCCR(data);

    (void)readM <MEM_PROG, Word> (reg.pc + 2);
    prefetch<POLLIPL>();
}